

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

int SoapySDRDevice_setCommandTime(SoapySDRDevice *device,longlong timeNs,char *what)

{
  char *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  exception *ex;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  undefined8 local_18;
  long *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,local_20,&local_41);
  (**(code **)(*local_10 + 0x2b0))(local_10,local_18,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return 0;
}

Assistant:

int SoapySDRDevice_setCommandTime(SoapySDRDevice *device, const long long timeNs, const char *what)
{
    __SOAPY_SDR_C_TRY
    device->setCommandTime(timeNs, what);
    __SOAPY_SDR_C_CATCH
}